

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_walldraw.cpp
# Opt level: O1

void swrenderer::R_DrawDrawSeg
               (drawseg_t *ds,int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,
               double yrepeat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  seg_t *psVar9;
  sector_t_conflict *psVar10;
  double dVar11;
  double bot;
  double dVar12;
  double dVar13;
  
  if (1 << (*(byte *)(rw_pic + 0xd) & 0x1f) == (uint)*(ushort *)(rw_pic + 0x3a)) {
    ProcessWall(x1,x2,uwal,dwal,swal,lwal,yrepeat,true);
  }
  else {
    psVar9 = ds->curline;
    psVar10 = psVar9->frontsector;
    dVar1 = (psVar10->ceilingplane).D;
    dVar2 = (psVar10->ceilingplane).normal.X;
    dVar3 = (psVar9->v1->p).X;
    dVar4 = (psVar9->v1->p).Y;
    dVar5 = (psVar10->ceilingplane).normal.Y;
    dVar11 = (psVar10->ceilingplane).negiC;
    dVar13 = (dVar4 * dVar5 + dVar3 * dVar2 + dVar1) * dVar11;
    dVar6 = (psVar10->floorplane).D;
    dVar7 = (psVar10->floorplane).normal.X;
    dVar8 = (psVar10->floorplane).normal.Y;
    dVar12 = (psVar10->floorplane).negiC;
    bot = (dVar4 * dVar8 + dVar3 * dVar7 + dVar6) * dVar12;
    dVar3 = (psVar9->v2->p).X;
    dVar4 = (psVar9->v2->p).Y;
    dVar11 = (dVar5 * dVar4 + dVar2 * dVar3 + dVar1) * dVar11;
    if (dVar11 <= dVar13) {
      dVar11 = dVar13;
    }
    dVar12 = (dVar4 * dVar8 + dVar3 * dVar7 + dVar6) * dVar12;
    if (((fake3D & 2) != 0) && (sclipTop <= dVar11)) {
      dVar11 = sclipTop;
    }
    if (dVar12 <= bot) {
      bot = dVar12;
    }
    if (((fake3D & 1) != 0) && (bot <= sclipBottom)) {
      bot = sclipBottom;
    }
    ProcessWallNP2(x1,x2,uwal,dwal,swal,lwal,yrepeat,dVar11,bot,true);
  }
  return;
}

Assistant:

void R_DrawDrawSeg(drawseg_t *ds, int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal, double yrepeat)
{
	if (rw_pic->GetHeight() != 1 << rw_pic->HeightBits)
	{
		double frontcz1 = ds->curline->frontsector->ceilingplane.ZatPoint(ds->curline->v1);
		double frontfz1 = ds->curline->frontsector->floorplane.ZatPoint(ds->curline->v1);
		double frontcz2 = ds->curline->frontsector->ceilingplane.ZatPoint(ds->curline->v2);
		double frontfz2 = ds->curline->frontsector->floorplane.ZatPoint(ds->curline->v2);
		double top = MAX(frontcz1, frontcz2);
		double bot = MIN(frontfz1, frontfz2);
		if (fake3D & FAKE3D_CLIPTOP)
		{
			top = MIN(top, sclipTop);
		}
		if (fake3D & FAKE3D_CLIPBOTTOM)
		{
			bot = MAX(bot, sclipBottom);
		}
		ProcessWallNP2(x1, x2, uwal, dwal, swal, lwal, yrepeat, top, bot, true);
	}
	else
	{
		ProcessWall(x1, x2, uwal, dwal, swal, lwal, yrepeat, true);
	}
}